

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

int apply_patch(cJSON *object,cJSON *patch,cJSON_bool case_sensitive)

{
  uchar *pointer;
  uchar *puVar1;
  bool bVar2;
  cJSON_bool cVar3;
  int iVar4;
  cJSON *pcVar5;
  cJSON *pcVar6;
  uchar *puVar7;
  char *pcVar8;
  char *pcVar9;
  uchar *puVar10;
  uint uVar11;
  size_t index;
  size_t local_38;
  
  if (case_sensitive == 0) {
    pcVar5 = cJSON_GetObjectItem(patch,"path");
    cVar3 = cJSON_IsString(pcVar5);
    if (cVar3 == 0) {
      return 2;
    }
    pcVar6 = cJSON_GetObjectItem(patch,"op");
  }
  else {
    pcVar5 = cJSON_GetObjectItemCaseSensitive(patch,"path");
    cVar3 = cJSON_IsString(pcVar5);
    if (cVar3 == 0) {
      return 2;
    }
    pcVar6 = cJSON_GetObjectItemCaseSensitive(patch,"op");
  }
  cVar3 = cJSON_IsString(pcVar6);
  if (cVar3 == 0) {
    return 3;
  }
  pcVar8 = pcVar6->valuestring;
  iVar4 = strcmp(pcVar8,"add");
  if (iVar4 == 0) {
    uVar11 = 1;
LAB_00103f3f:
    puVar7 = (uchar *)pcVar5->valuestring;
    if (*puVar7 == '\0') {
      pcVar5 = get_object_item(patch,"value",case_sensitive);
      if (pcVar5 == (cJSON *)0x0) {
        return 7;
      }
      pcVar5 = cJSON_Duplicate(pcVar5,1);
      if (pcVar5 == (cJSON *)0x0) {
        return 8;
      }
      overwrite_item(object,*pcVar5);
      cJSON_free(pcVar5);
      if (object->string != (char *)0x0) {
        cJSON_free(object->string);
        object->string = (char *)0x0;
        return 0;
      }
      return 0;
    }
LAB_00104009:
    if ((uVar11 & 0xfffffffe) != 4) {
      if ((uVar11 & 0xfffffffe) == 2) {
        bVar2 = false;
        goto LAB_00104020;
      }
      goto LAB_00104042;
    }
    if (case_sensitive == 0) {
      pcVar6 = cJSON_GetObjectItem(patch,"from");
    }
    else {
      pcVar6 = cJSON_GetObjectItemCaseSensitive(patch,"from");
    }
    if (pcVar6 == (cJSON *)0x0) {
      return 4;
    }
    if (uVar11 == 5) {
      pcVar6 = get_item_from_pointer(object,pcVar6->valuestring,case_sensitive);
      if (pcVar6 == (cJSON *)0x0) {
        return 5;
      }
      pcVar6 = cJSON_Duplicate(pcVar6,1);
      if (pcVar6 == (cJSON *)0x0) {
        return 6;
      }
    }
    else {
      if (uVar11 != 4) {
        return 5;
      }
      pcVar6 = detach_path(object,(uchar *)pcVar6->valuestring,case_sensitive);
      if (pcVar6 == (cJSON *)0x0) {
        return 5;
      }
    }
  }
  else {
    iVar4 = strcmp(pcVar8,"remove");
    if (iVar4 != 0) {
      iVar4 = strcmp(pcVar8,"replace");
      if (iVar4 == 0) {
        uVar11 = 3;
        goto LAB_00103f3f;
      }
      iVar4 = strcmp(pcVar8,"move");
      if (iVar4 == 0) {
        uVar11 = 4;
      }
      else {
        iVar4 = strcmp(pcVar8,"copy");
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar8,"test");
          if (iVar4 == 0) {
            pcVar5 = get_item_from_pointer(object,pcVar5->valuestring,case_sensitive);
            if (case_sensitive == 0) {
              pcVar6 = cJSON_GetObjectItem(patch,"value");
            }
            else {
              pcVar6 = cJSON_GetObjectItemCaseSensitive(patch,"value");
            }
            cVar3 = compare_json(pcVar5,pcVar6,case_sensitive);
            return (uint)(cVar3 == 0);
          }
          return 3;
        }
        uVar11 = 5;
      }
      puVar7 = (uchar *)pcVar5->valuestring;
      goto LAB_00104009;
    }
    puVar7 = (uchar *)pcVar5->valuestring;
    if (*puVar7 == '\0') {
      overwrite_item(object,(cJSON)ZEXT1664(ZEXT816(0)));
      return 0;
    }
    bVar2 = true;
LAB_00104020:
    pcVar6 = detach_path(object,puVar7,case_sensitive);
    if (pcVar6 == (cJSON *)0x0) {
      return 0xd;
    }
    cJSON_Delete(pcVar6);
    if (bVar2) {
      return 0;
    }
LAB_00104042:
    if (case_sensitive == 0) {
      pcVar6 = cJSON_GetObjectItem(patch,"value");
    }
    else {
      pcVar6 = cJSON_GetObjectItemCaseSensitive(patch,"value");
    }
    if (pcVar6 == (cJSON *)0x0) {
      return 7;
    }
    pcVar6 = cJSON_Duplicate(pcVar6,1);
    if (pcVar6 == (cJSON *)0x0) {
      return 8;
    }
  }
  puVar7 = cJSONUtils_strdup((uchar *)pcVar5->valuestring);
  pcVar8 = strrchr((char *)puVar7,0x2f);
  if (pcVar8 != (char *)0x0) {
    *pcVar8 = '\0';
    pointer = (uchar *)(pcVar8 + 1);
    pcVar5 = get_item_from_pointer(object,(char *)puVar7,case_sensitive);
    pcVar9 = pcVar8 + 2;
    puVar10 = pointer;
    do {
      if (*puVar10 == '~') {
        puVar1 = puVar10 + 1;
        puVar10 = puVar10 + 1;
        if (*puVar1 == '1') {
          *pcVar9 = '/';
        }
        else {
          if (*puVar1 != '0') goto LAB_0010417a;
          pcVar9[-1] = '~';
        }
      }
      else if (*puVar10 == '\0') goto LAB_00104176;
      puVar10 = puVar10 + 1;
      pcVar9 = pcVar9 + 1;
    } while( true );
  }
  get_item_from_pointer(object,(char *)puVar7,case_sensitive);
LAB_001041e8:
  iVar4 = 9;
  goto LAB_001041ed;
LAB_00104176:
  pcVar9[-1] = '\0';
LAB_0010417a:
  if (pcVar5 == (cJSON *)0x0) goto LAB_001041e8;
  cVar3 = cJSON_IsArray(pcVar5);
  if (cVar3 == 0) {
    cVar3 = cJSON_IsObject(pcVar5);
    if (cVar3 == 0) {
      iVar4 = 0;
      goto LAB_001041ed;
    }
    if (case_sensitive == 0) {
      cJSON_DeleteItemFromObject(pcVar5,(char *)pointer);
    }
    else {
      cJSON_DeleteItemFromObjectCaseSensitive(pcVar5,(char *)pointer);
    }
    cJSON_AddItemToObject(pcVar5,(char *)pointer,pcVar6);
LAB_00104298:
    iVar4 = 0;
    goto LAB_0010429a;
  }
  if ((*pointer == '-') && (pcVar8[2] == '\0')) {
    cJSON_AddItemToArray(pcVar5,pcVar6);
    goto LAB_00104298;
  }
  local_38 = 0;
  cVar3 = decode_array_index_from_pointer(pointer,&local_38);
  if (cVar3 == 0) {
    iVar4 = 0xb;
  }
  else {
    cVar3 = insert_item_in_array(pcVar5,local_38,pcVar6);
    if (cVar3 != 0) goto LAB_00104298;
    iVar4 = 10;
  }
LAB_001041ed:
  cJSON_Delete(pcVar6);
LAB_0010429a:
  if (puVar7 != (uchar *)0x0) {
    cJSON_free(puVar7);
  }
  return iVar4;
}

Assistant:

static int apply_patch(cJSON *object, const cJSON *patch, const cJSON_bool case_sensitive)
{
    cJSON *path = NULL;
    cJSON *value = NULL;
    cJSON *parent = NULL;
    enum patch_operation opcode = INVALID;
    unsigned char *parent_pointer = NULL;
    unsigned char *child_pointer = NULL;
    int status = 0;

    path = get_object_item(patch, "path", case_sensitive);
    if (!cJSON_IsString(path))
    {
        /* malformed patch. */
        status = 2;
        goto cleanup;
    }

    opcode = decode_patch_operation(patch, case_sensitive);
    if (opcode == INVALID)
    {
        status = 3;
        goto cleanup;
    }
    else if (opcode == TEST)
    {
        /* compare value: {...} with the given path */
        status = !compare_json(get_item_from_pointer(object, path->valuestring, case_sensitive), get_object_item(patch, "value", case_sensitive), case_sensitive);
        goto cleanup;
    }

    /* special case for replacing the root */
    if (path->valuestring[0] == '\0')
    {
        if (opcode == REMOVE)
        {
            static const cJSON invalid = { NULL, NULL, NULL, cJSON_Invalid, NULL, 0, 0, NULL};

            overwrite_item(object, invalid);

            status = 0;
            goto cleanup;
        }

        if ((opcode == REPLACE) || (opcode == ADD))
        {
            value = get_object_item(patch, "value", case_sensitive);
            if (value == NULL)
            {
                /* missing "value" for add/replace. */
                status = 7;
                goto cleanup;
            }

            value = cJSON_Duplicate(value, 1);
            if (value == NULL)
            {
                /* out of memory for add/replace. */
                status = 8;
                goto cleanup;
            }

            overwrite_item(object, *value);

            /* delete the duplicated value */
            cJSON_free(value);
            value = NULL;

            /* the string "value" isn't needed */
            if (object->string != NULL)
            {
                cJSON_free(object->string);
                object->string = NULL;
            }

            status = 0;
            goto cleanup;
        }
    }

    if ((opcode == REMOVE) || (opcode == REPLACE))
    {
        /* Get rid of old. */
        cJSON *old_item = detach_path(object, (unsigned char*)path->valuestring, case_sensitive);
        if (old_item == NULL)
        {
            status = 13;
            goto cleanup;
        }
        cJSON_Delete(old_item);
        if (opcode == REMOVE)
        {
            /* For Remove, this job is done. */
            status = 0;
            goto cleanup;
        }
    }

    /* Copy/Move uses "from". */
    if ((opcode == MOVE) || (opcode == COPY))
    {
        cJSON *from = get_object_item(patch, "from", case_sensitive);
        if (from == NULL)
        {
            /* missing "from" for copy/move. */
            status = 4;
            goto cleanup;
        }

        if (opcode == MOVE)
        {
            value = detach_path(object, (unsigned char*)from->valuestring, case_sensitive);
        }
        if (opcode == COPY)
        {
            value = get_item_from_pointer(object, from->valuestring, case_sensitive);
        }
        if (value == NULL)
        {
            /* missing "from" for copy/move. */
            status = 5;
            goto cleanup;
        }
        if (opcode == COPY)
        {
            value = cJSON_Duplicate(value, 1);
        }
        if (value == NULL)
        {
            /* out of memory for copy/move. */
            status = 6;
            goto cleanup;
        }
    }
    else /* Add/Replace uses "value". */
    {
        value = get_object_item(patch, "value", case_sensitive);
        if (value == NULL)
        {
            /* missing "value" for add/replace. */
            status = 7;
            goto cleanup;
        }
        value = cJSON_Duplicate(value, 1);
        if (value == NULL)
        {
            /* out of memory for add/replace. */
            status = 8;
            goto cleanup;
        }
    }

    /* Now, just add "value" to "path". */

    /* split pointer in parent and child */
    parent_pointer = cJSONUtils_strdup((unsigned char*)path->valuestring);
    child_pointer = (unsigned char*)strrchr((char*)parent_pointer, '/');
    if (child_pointer != NULL)
    {
        child_pointer[0] = '\0';
        child_pointer++;
    }
    parent = get_item_from_pointer(object, (char*)parent_pointer, case_sensitive);
    decode_pointer_inplace(child_pointer);

    /* add, remove, replace, move, copy, test. */
    if ((parent == NULL) || (child_pointer == NULL))
    {
        /* Couldn't find object to add to. */
        status = 9;
        goto cleanup;
    }
    else if (cJSON_IsArray(parent))
    {
        if (strcmp((char*)child_pointer, "-") == 0)
        {
            cJSON_AddItemToArray(parent, value);
            value = NULL;
        }
        else
        {
            size_t index = 0;
            if (!decode_array_index_from_pointer(child_pointer, &index))
            {
                status = 11;
                goto cleanup;
            }

            if (!insert_item_in_array(parent, index, value))
            {
                status = 10;
                goto cleanup;
            }
            value = NULL;
        }
    }
    else if (cJSON_IsObject(parent))
    {
        if (case_sensitive)
        {
            cJSON_DeleteItemFromObjectCaseSensitive(parent, (char*)child_pointer);
        }
        else
        {
            cJSON_DeleteItemFromObject(parent, (char*)child_pointer);
        }
        cJSON_AddItemToObject(parent, (char*)child_pointer, value);
        value = NULL;
    }

cleanup:
    if (value != NULL)
    {
        cJSON_Delete(value);
    }
    if (parent_pointer != NULL)
    {
        cJSON_free(parent_pointer);
    }

    return status;
}